

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileParser::IssueError(cmListFileParser *this,string *text)

{
  cmListFileBacktrace local_90;
  undefined1 local_80 [8];
  cmListFileBacktrace lfbt;
  undefined1 local_60 [8];
  cmListFileContext lfc;
  string *text_local;
  cmListFileParser *this_local;
  
  lfc.Line = (long)text;
  cmListFileContext::cmListFileContext((cmListFileContext *)local_60);
  std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),this->FileName);
  lfc.FilePath.field_2._8_8_ = cmListFileLexer_GetCurrentLine(this->Lexer);
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_80,&this->Backtrace);
  cmListFileBacktrace::Push(&local_90,(cmListFileContext *)local_80);
  cmListFileBacktrace::operator=((cmListFileBacktrace *)local_80,&local_90);
  cmListFileBacktrace::~cmListFileBacktrace(&local_90);
  cmMessenger::IssueMessage
            (this->Messenger,FATAL_ERROR,(string *)lfc.Line,(cmListFileBacktrace *)local_80);
  cmSystemTools::SetFatalErrorOccured();
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_80);
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_60);
  return;
}

Assistant:

void cmListFileParser::IssueError(const std::string& text) const
{
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = cmListFileLexer_GetCurrentLine(this->Lexer);
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, text, lfbt);
  cmSystemTools::SetFatalErrorOccured();
}